

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O1

PyObject * libxml_xmlDocPtrWrap(xmlDocPtr doc)

{
  PyObject *pPVar1;
  
  if (doc != (xmlDocPtr)0x0) {
    pPVar1 = (PyObject *)PyCapsule_New(doc,"xmlDocPtr",0);
    return pPVar1;
  }
  __Py_NoneStruct = __Py_NoneStruct + 1;
  return (PyObject *)&_Py_NoneStruct;
}

Assistant:

PyObject *
libxml_xmlDocPtrWrap(xmlDocPtr doc)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_xmlDocPtrWrap: doc = %p\n", doc);
#endif
    if (doc == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    /* TODO: look at deallocation */
    ret = PyCapsule_New((void *) doc, (char *) "xmlDocPtr", NULL);
    return (ret);
}